

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int CollectionSetHeader(unqlite_kv_engine *pEngine,unqlite_col *pCol,jx9_int64 iRec,jx9_int64 iTotal
                       ,jx9_value *pSchema)

{
  SyBlob *pBlob;
  unqlite_kv_methods *puVar1;
  void *pvVar2;
  sxi32 sVar3;
  int iVar4;
  sxu64 n64;
  unqlite_vfs *pVfs;
  sxu32 iDos;
  uint local_34;
  
  if (pEngine == (unqlite_kv_engine *)0x0) {
    pEngine = ((pCol->pVm->pDb->sDB).pPager)->pEngine;
  }
  pBlob = &pCol->sHeader;
  puVar1 = pEngine->pIo->pMethods;
  if ((pCol->sHeader).nByte == 0) {
    n64 = 0x611e;
    sVar3 = SyBlobAppendBig16(pBlob,0x611e);
    if (sVar3 != 0) {
      return sVar3;
    }
    sVar3 = SyBlobAppendBig64(pBlob,n64);
    if (sVar3 != 0) {
      return sVar3;
    }
    pVfs = (unqlite_vfs *)pBlob;
    sVar3 = SyBlobAppendBig64(pBlob,n64);
    if (sVar3 != 0) {
      return sVar3;
    }
    unixCurrentTime(pVfs,&pCol->sCreation);
    SyTimeFormatToDos(&pCol->sCreation,&iDos);
    local_34 = iDos >> 0x18 | (iDos & 0xff0000) >> 8 | (iDos & 0xff00) << 8 | iDos << 0x18;
    sVar3 = SyBlobAppend(pBlob,&local_34,4);
    if (sVar3 != 0) {
      return sVar3;
    }
    pCol->nSchemaOfft = (pCol->sHeader).nByte;
  }
  else {
    pvVar2 = (pCol->sHeader).pBlob;
    if (-1 < iRec) {
      SyBigEndianPack64((uchar *)((long)pvVar2 + 2),iRec);
    }
    if (iTotal < 0) {
      if (pSchema == (jx9_value *)0x0) {
        if (iRec < 0) {
          return 0;
        }
        goto LAB_00117a84;
      }
    }
    else {
      SyBigEndianPack64((uchar *)((long)pvVar2 + 10),iTotal);
      if (pSchema == (jx9_value *)0x0) goto LAB_00117a84;
    }
    if (pCol->nSchemaOfft < (pCol->sHeader).nByte) {
      (pCol->sHeader).nByte = pCol->nSchemaOfft;
    }
    sVar3 = FastJsonEncode(pSchema,pBlob,0);
    if (sVar3 != 0) {
      return sVar3;
    }
    jx9MemObjStore(pSchema,&pCol->sSchema);
  }
LAB_00117a84:
  iVar4 = (*puVar1->xReplace)(pEngine,(pCol->sName).zString,(pCol->sName).nByte,
                              (pCol->sHeader).pBlob,(unqlite_int64)(pCol->sHeader).nByte);
  if (iVar4 == 0) {
    return 0;
  }
  unqliteGenErrorFormat
            (pCol->pVm->pDb,"Cannot save collection \'%z\' header in the underlying storage engine",
             &pCol->sName);
  return iVar4;
}

Assistant:

static int CollectionSetHeader(
	unqlite_kv_engine *pEngine, /* Underlying KV storage engine */
	unqlite_col *pCol,          /* Target collection */
	jx9_int64 iRec,             /* Last record ID */
	jx9_int64 iTotal,           /* Total number of records in this collection */
	jx9_value *pSchema          /* Collection schema */
	)
{
	SyBlob *pHeader = &pCol->sHeader;
	unqlite_kv_methods *pMethods;
	int iWrite = 0;
	int rc;
	if( pEngine == 0 ){
		/* Default storage engine */
		pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	}
	pMethods = pEngine->pIo->pMethods;
	if( SyBlobLength(pHeader) < 1 ){
		Sytm *pCreate = &pCol->sCreation; /* Creation time */
		unqlite_vfs *pVfs;
		sxu32 iDos;
		/* Magic number */
		rc = SyBlobAppendBig16(pHeader,UNQLITE_COLLECTION_MAGIC);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initial record ID */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Total records in the collection */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		pVfs = (unqlite_vfs *)unqliteExportBuiltinVfs();
		/* Creation time of the collection */
		if( pVfs->xCurrentTime ){
			/* Get the creation time */
			pVfs->xCurrentTime(pVfs,pCreate);
		}else{
			/* Zero the structure */
			SyZero(pCreate,sizeof(Sytm));
		}
		/* Convert to DOS time */
		SyTimeFormatToDos(pCreate,&iDos);
		rc = SyBlobAppendBig32(pHeader,iDos);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Offset to start writing collection schema */
		pCol->nSchemaOfft = SyBlobLength(pHeader);
		iWrite = 1;
	}else{
		unsigned char *zBinary = (unsigned char *)SyBlobData(pHeader);
		/* Header update */
		if( iRec >= 0 ){
			/* Update record ID */
			SyBigEndianPack64(&zBinary[2/* Magic number*/],(sxu64)iRec);
			iWrite = 1;
		}
		if( iTotal >= 0 ){
			/* Total records */
			SyBigEndianPack64(&zBinary[2/* Magic number*/+8/* Record ID*/],(sxu64)iTotal);
			iWrite = 1;
		}
		if( pSchema ){
			/* Collection Schema */
			SyBlobTruncate(pHeader,pCol->nSchemaOfft);
			/* Encode the schema to FastJson */
			rc = FastJsonEncode(pSchema,pHeader,0);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Copy the collection schema */
			jx9MemObjStore(pSchema,&pCol->sSchema);
			iWrite = 1;
		}
	}
	if( iWrite ){
		SyString *pId = &pCol->sName;
		/* Reflect the disk and/or in-memory image */
		rc = pMethods->xReplace(pEngine,
			(const void *)pId->zString,pId->nByte,
			SyBlobData(pHeader),SyBlobLength(pHeader)
			);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot save collection '%z' header in the underlying storage engine",
				pId
				);
			return rc;
		}
	}
	return UNQLITE_OK;
}